

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decoder_suite.cpp
# Opt level: O0

void int16_suite::test_max(void)

{
  undefined4 local_54;
  value local_50;
  short local_4a;
  type local_48 [2];
  undefined4 local_44;
  value local_40 [2];
  undefined1 local_38 [8];
  decoder decoder;
  value_type input [3];
  
  decoder.current.view._M_str._5_2_ = 0xffb2;
  decoder.current.view._M_str._7_1_ = 0x7f;
  trial::protocol::bintoken::detail::decoder::decoder<unsigned_char[3]>
            ((decoder *)local_38,(uchar (*) [3])((long)&decoder.current.view._M_str + 5));
  local_40[0] = trial::protocol::bintoken::detail::decoder::code((decoder *)local_38);
  local_44 = 0xb2;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::protocol::bintoken::token::code::value,trial::protocol::bintoken::token::code::value>
            ("decoder.code()","token::code::int16",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/decoder_suite.cpp"
             ,0x128,"void int16_suite::test_max()",local_40,&local_44);
  local_48[0] = trial::protocol::bintoken::detail::decoder::
                value<trial::protocol::bintoken::token::int16>((decoder *)local_38);
  local_4a = std::numeric_limits<short>::max();
  boost::detail::test_with_impl<boost::detail::lw_test_eq,short,short>
            ("decoder.value<token::int16>()","std::numeric_limits<token::int16::type>::max()",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/decoder_suite.cpp"
             ,0x12a,"void int16_suite::test_max()",local_48,&local_4a);
  trial::protocol::bintoken::detail::decoder::next((decoder *)local_38);
  local_50 = trial::protocol::bintoken::detail::decoder::code((decoder *)local_38);
  local_54 = 0;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::protocol::bintoken::token::code::value,trial::protocol::bintoken::token::code::value>
            ("decoder.code()","token::code::end",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/decoder_suite.cpp"
             ,300,"void int16_suite::test_max()",&local_50,&local_54);
  return;
}

Assistant:

void test_max()
{
    const value_type input[] = { token::code::int16, 0xFF, 0x7F };
    format::detail::decoder decoder(input);
    TRIAL_PROTOCOL_TEST_EQUAL(decoder.code(), token::code::int16);
    TRIAL_PROTOCOL_TEST_EQUAL(decoder.value<token::int16>(),
                              std::numeric_limits<token::int16::type>::max());
    decoder.next();
    TRIAL_PROTOCOL_TEST_EQUAL(decoder.code(), token::code::end);
}